

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O3

void __thiscall FIX::FieldMap::addGroupPtr(FieldMap *this,int tag,FieldMap *group,bool setCount)

{
  iterator __position;
  vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>> *this_00;
  int local_84;
  FieldMap *local_80;
  FieldBase local_78;
  
  if (group != (FieldMap *)0x0) {
    local_84 = tag;
    local_80 = group;
    this_00 = (vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>> *)
              std::
              map<int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<FIX::FieldMap_*,_std::allocator<FIX::FieldMap_*>_>_>_>_>
              ::operator[](&this->m_groups,&local_84);
    __position._M_current = *(FieldMap ***)(this_00 + 8);
    if (__position._M_current == *(FieldMap ***)(this_00 + 0x10)) {
      std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>::
      _M_realloc_insert<FIX::FieldMap*const&>(this_00,__position,&local_80);
    }
    else {
      *__position._M_current = group;
      *(long *)(this_00 + 8) = *(long *)(this_00 + 8) + 8;
    }
    if (setCount) {
      IntField::IntField((IntField *)&local_78,local_84,
                         (int)((ulong)(*(long *)(this_00 + 8) - *(long *)this_00) >> 3));
      setField(this,&local_78,true);
      FieldBase::~FieldBase(&local_78);
    }
  }
  return;
}

Assistant:

void FieldMap::addGroupPtr(int tag, FieldMap *group, bool setCount) {
  if (group == 0) {
    return;
  }

  std::vector<FieldMap *> &groups = m_groups[tag];
  groups.push_back(group);

  if (setCount) {
    setField(IntField(tag, (int)groups.size()));
  }
}